

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_alloc.c
# Opt level: O0

void * lj_alloc_f(void *msp,void *ptr,size_t osize,size_t nsize)

{
  long in_RCX;
  long in_RSI;
  size_t in_stack_00000068;
  void *in_stack_00000070;
  void *in_stack_00000078;
  size_t in_stack_000000c0;
  void *in_stack_000000c8;
  void *in_stack_00000150;
  void *in_stack_00000158;
  undefined8 local_8;
  
  if (in_RCX == 0) {
    local_8 = lj_alloc_free(in_stack_00000158,in_stack_00000150);
  }
  else if (in_RSI == 0) {
    local_8 = lj_alloc_malloc(in_stack_000000c8,in_stack_000000c0);
  }
  else {
    local_8 = lj_alloc_realloc(in_stack_00000078,in_stack_00000070,in_stack_00000068);
  }
  return local_8;
}

Assistant:

void *lj_alloc_f(void *msp, void *ptr, size_t osize, size_t nsize)
{
  (void)osize;
  if (nsize == 0) {
    return lj_alloc_free(msp, ptr);
  } else if (ptr == NULL) {
    return lj_alloc_malloc(msp, nsize);
  } else {
    return lj_alloc_realloc(msp, ptr, nsize);
  }
}